

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Option<const_int_&> __thiscall
Lib::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
::tryGet(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  __type _Var1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  uint *puVar3;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  uint *puVar4;
  uint *puVar5;
  
  uVar2 = DefaultHash::hash(in_RDX);
  uVar2 = uVar2 + (uVar2 == 0);
  puVar3 = (uint *)key->_M_string_length;
  puVar4 = (uint *)0x0;
  puVar5 = puVar3 + ((ulong)uVar2 % (ulong)*(uint *)&(key->_M_dataplus)._M_p) * 0xc;
  do {
    if (*puVar5 == 0) {
LAB_004c8a72:
      *(uint **)this = puVar4;
      return (OptionBase<const_int_&>)(OptionBase<const_int_&>)this;
    }
    if (*puVar5 == uVar2) {
      _Var1 = std::operator==(in_RAX,unaff_RBX);
      if (_Var1) {
        puVar4 = puVar5 + 10;
        goto LAB_004c8a72;
      }
      puVar3 = (uint *)key->_M_string_length;
    }
    puVar5 = puVar5 + 0xc;
    if (puVar5 == (uint *)(key->field_2)._M_allocated_capacity) {
      puVar5 = puVar3;
    }
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }